

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::CheckFuncTypeIndex(SharedValidator *this,Var *sig_var,FuncType *out)

{
  Result RVar1;
  char *pcVar2;
  iterator iVar3;
  int __c;
  int __c_00;
  Var *__s;
  FuncType *__s_00;
  FuncType local_a8;
  Var local_70;
  
  __s_00 = &local_a8;
  Var::Var(&local_70,sig_var);
  __s = &local_70;
  RVar1 = CheckIndex(this,&local_70,this->num_types_,"function type");
  Var::~Var(&local_70);
  if (RVar1.enum_ == Error) {
    local_a8.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a8.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a8.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    FuncType::operator=(out,&local_a8);
    FuncType::~FuncType(&local_a8);
    RVar1.enum_ = Error;
  }
  else {
    pcVar2 = Var::index(sig_var,(char *)__s,__c);
    local_a8.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_a8.params.
                           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,(int)pcVar2);
    iVar3 = std::
            _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_wabt::SharedValidator::FuncType>,_std::_Select1st<std::pair<const_unsigned_int,_wabt::SharedValidator::FuncType>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wabt::SharedValidator::FuncType>_>_>
            ::find(&(this->func_types_)._M_t,(key_type *)&local_a8);
    if ((_Rb_tree_header *)iVar3._M_node == &(this->func_types_)._M_t._M_impl.super__Rb_tree_header)
    {
      pcVar2 = Var::index(sig_var,(char *)__s_00,__c_00);
      RVar1 = PrintError(this,&sig_var->loc,"type %d is not a function",(ulong)pcVar2 & 0xffffffff);
    }
    else {
      RVar1.enum_ = Ok;
      if (out != (FuncType *)0x0) {
        FuncType::operator=(out,(FuncType *)&iVar3._M_node[1]._M_parent);
        RVar1.enum_ = Ok;
      }
    }
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result SharedValidator::CheckFuncTypeIndex(Var sig_var, FuncType* out) {
  Result result = CheckIndex(sig_var, num_types_, "function type");
  if (Failed(result)) {
    *out = FuncType{};
    return Result::Error;
  }

  auto iter = func_types_.find(sig_var.index());
  if (iter == func_types_.end()) {
    return PrintError(sig_var.loc, "type %d is not a function",
                      sig_var.index());
  }

  if (out) {
    *out = iter->second;
  }
  return Result::Ok;
}